

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

double * __thiscall
google::protobuf::Map<std::__cxx11::string,double>::at<std::__cxx11::string>
          (Map<std::__cxx11::string,double> *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  pointer pcVar1;
  LogMessage *pLVar2;
  LogFinisher local_79;
  string local_78;
  LogMessage local_58;
  
  InnerMap::FindHelper<std::__cxx11::string>
            ((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_unsigned_long>
              *)&local_58,this,key,(TreeIterator *)0x0);
  if (local_58._0_8_ == 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x4cb);
    pLVar2 = internal::LogMessage::operator<<(&local_58,"CHECK failed: it != end(): ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"key not found: ");
    pcVar1 = (key->_M_dataplus)._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + key->_M_string_length);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,&local_78);
    internal::LogFinisher::operator=(&local_79,pLVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_58._0_8_ == 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  return (double *)(local_58._0_8_ + 0x20);
}

Assistant:

const T& at(const key_arg<K>& key) const {
    const_iterator it = find(key);
    GOOGLE_CHECK(it != end()) << "key not found: " << static_cast<Key>(key);
    return it->second;
  }